

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void progress::clear(ClearMode mode)

{
  if (show_progress) {
    progress_cleared = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\r\x1b[K",4);
    return;
  }
  return;
}

Assistant:

void progress::clear(ClearMode mode) {
	
	if(!show_progress) {
		return;
	}
	
	progress_cleared = true;
	
	#if defined(_WIN32)
	
	if(mode == FastClear) {
		
		/*
		 * If we overwrite the whole line with spaces, windows console likes to draw
		 * the empty line, even if it will be overwritten in the same flush(),
		 * causing the progress bar to flicker when updated.
		 * To work around this, don't actually clear the line if we are just going to
		 * overwrite it anyway.
		 * The progress bar still flickers when there is other output printed, but
		 * it seems there is no way around that without using the console API to manually
		 * scroll the output.
		 */
		
		std::cout << '\r';
		
		return;
		
	} else if(mode == DeferredClear && isatty(1)) {
		
		/*
		 * Special clear mode that leaves the original line but insert new lines before it
		 * until the next carriage return.
		 */
		
		std::cout << "\r\x1b[3K";
		
		return;
		
	}
	
	#else
	
	(void)mode;
	
	#endif
	
	// Use the ANSI/VT100 control sequence to clear the current line
	
	std::cout << "\r\x1b[K";
	
}